

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::setVelocity(MidiMessage *this,int value)

{
  bool bVar1;
  pointer puVar2;
  
  bVar1 = isNote(this);
  if (bVar1) {
    puVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (int)puVar2 < 3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
      puVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    puVar2[2] = (uchar)value;
  }
  return;
}

Assistant:

void MidiMessage::setVelocity(int value) {
	if (isNote()) {
		setP2(value & 0xff);
	} else {
		// don't do anything since this is not a note-related message.
	}
}